

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O1

void __thiscall QTextHtmlParser::parse(QTextHtmlParser *this)

{
  char16_t cVar1;
  int iVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = this->pos;
  if (iVar2 < this->len) {
    do {
      this->pos = iVar2 + 1;
      cVar1 = (this->txt).d.ptr[iVar2];
      if (cVar1 == L'&') {
        parseEntity(&local_38,this);
        iVar3 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
        QString::append(&iVar3.i[-1]->text);
        if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (cVar1 == L'<') {
        parseTag(this);
      }
      else {
        iVar3 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
        QString::append((QChar)((short)iVar3.i[-1] + L'\x18'));
      }
      iVar2 = this->pos;
    } while (iVar2 < this->len);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlParser::parse()
{
    while (pos < len) {
        QChar c = txt.at(pos++);
        if (c == u'<') {
            parseTag();
        } else if (c == u'&') {
            nodes.last()->text += parseEntity();
        } else {
            nodes.last()->text += c;
        }
    }
}